

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall testing::internal::MatchMatrix::Randomize(MatchMatrix *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = *(ulong *)this;
  if (uVar3 != 0) {
    uVar5 = *(ulong *)(this + 8);
    uVar4 = 0;
    do {
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar3 = 0;
        do {
          lVar1 = *(long *)(this + 0x10);
          iVar2 = rand();
          *(byte *)(uVar3 + uVar5 * uVar4 + lVar1) = (byte)iVar2 & 1;
          uVar3 = uVar3 + 1;
          uVar5 = *(ulong *)(this + 8);
        } while (uVar3 < uVar5);
        uVar3 = *(ulong *)this;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  return;
}

Assistant:

size_t LhsSize() const { return num_elements_; }